

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

Am_Time am_Handle_Timing_Events(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Interactor_Time_Event *new_event;
  Am_Time_Data *in_RDI;
  Am_Object local_88;
  Am_Time local_80;
  int local_74;
  Am_Time local_70;
  Am_Time inter_start_time;
  Am_Slot_Key method_slot;
  Am_Object method_object;
  Am_Time elapsed_time;
  Am_Interactor_Time_Event *next_event;
  Am_Time now;
  Am_Time next_timeout_time;
  Am_Timer_Method method;
  bool ticked;
  Am_Time *return_time;
  
  bVar3 = false;
  bVar1 = false;
  Am_Time::Am_Time((Am_Time *)in_RDI);
  if ((Am_Global_Timer_State != Am_TIMERS_SUSPENDED) &&
     (bVar2 = Am_Value_List::Empty(&am_timing_events), !bVar2)) {
    Am_Timer_Method::Am_Timer_Method((Am_Timer_Method *)&next_timeout_time);
    Am_Time::Am_Time(&now);
    am_clock();
    Am_Time::Am_Time((Am_Time *)&method_object);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa0);
    Am_Time::Am_Time(&local_70);
    while( true ) {
      Am_Value_List::Start(&am_timing_events);
      bVar2 = Am_Value_List::Empty(&am_timing_events);
      if (bVar2) break;
      pAVar4 = Am_Value_List::Get(&am_timing_events);
      new_event = (Am_Interactor_Time_Event *)Am_Value::operator_cast_to_void_(pAVar4);
      bVar2 = Am_Time::operator<(&new_event->next_timeout,(Am_Time *)&next_event);
      if (!bVar2) {
        if ((bVar3) && (Am_Global_Timer_State == Am_TIMERS_SINGLE_STEP)) {
          Am_Set_Timer_State(Am_TIMERS_SUSPENDED);
        }
        Am_Time::operator=((Am_Time *)in_RDI,&new_event->next_timeout);
        local_74 = 0;
        goto LAB_0026e9d0;
      }
      Am_Time::operator+=(&new_event->next_timeout,&new_event->delta);
      Am_Value_List::Delete(&am_timing_events,true);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffa0,(Am_Object *)new_event);
      inter_start_time.data._6_2_ = new_event->method_slot;
      Am_Time::operator=(&local_70,&new_event->start_time);
      if ((new_event->only_once & 1U) == 0) {
        am_add_timing_event(new_event);
      }
      else if (new_event != (Am_Interactor_Time_Event *)0x0) {
        Am_Interactor_Time_Event::~Am_Interactor_Time_Event(new_event);
        operator_delete(new_event);
      }
      bVar3 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffa0);
      if (bVar3) {
        pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa0,inter_start_time.data._6_2_,0)
        ;
        Am_Timer_Method::operator=((Am_Timer_Method *)&next_timeout_time,pAVar4);
        bVar3 = Am_Timer_Method::Valid((Am_Timer_Method *)&next_timeout_time);
        if (bVar3) {
          Am_Time::operator-(&local_80,(Am_Time *)&next_event);
          Am_Time::operator=((Am_Time *)&method_object,&local_80);
          Am_Time::~Am_Time(&local_80);
          Am_Object::Am_Object(&local_88,(Am_Object *)&stack0xffffffffffffffa0);
          (*(code *)method.from_wrapper)(&local_88,&method_object);
          Am_Object::~Am_Object(&local_88);
        }
      }
      bVar3 = true;
    }
    bVar1 = true;
    local_74 = 1;
LAB_0026e9d0:
    Am_Time::~Am_Time(&local_70);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa0);
    Am_Time::~Am_Time((Am_Time *)&method_object);
    Am_Time::~Am_Time((Am_Time *)&next_event);
    Am_Time::~Am_Time(&now);
    if (local_74 != 0) goto LAB_0026ea42;
  }
  bVar1 = true;
  local_74 = 1;
LAB_0026ea42:
  if (!bVar1) {
    Am_Time::~Am_Time((Am_Time *)in_RDI);
  }
  return (Am_Time)in_RDI;
}

Assistant:

static Am_Time
am_Handle_Timing_Events()
{
  bool ticked = false;
  Am_Time return_time; // next deadline
  if (Am_Global_Timer_State != Am_TIMERS_SUSPENDED &&
      !am_timing_events.Empty()) {
    Am_Timer_Method method;
    Am_Time next_timeout_time;
    Am_Time now = am_clock();
    Am_Interactor_Time_Event *next_event;
    Am_Time elapsed_time;

    Am_Object method_object;
    Am_Slot_Key method_slot;
    Am_Time inter_start_time;
    while (true) { // stop when the next event is not past
      am_timing_events.Start();
      if (am_timing_events.Empty()) {
        //deleted the last event
        return return_time; // will be uninitialized
      }
      next_event = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
      if (next_event->next_timeout < now) {
        // Deal with moving the timing event in its queue _before_ we
        // call the method.  The method might call Am_Stop_Timer,
        // removing this event from the queue, which deletes it.
        next_event->next_timeout += next_event->delta;
        am_timing_events.Delete();
        method_object = next_event->object;
        method_slot = next_event->method_slot;
        inter_start_time = next_event->start_time;
        if (next_event->only_once)
          delete next_event;
        else
          am_add_timing_event(next_event);
        if (method_object.Valid()) {
          //  Call the method for this object
          method = method_object.Get(method_slot);
          if (method.Valid()) {
            elapsed_time = now - inter_start_time;
            method.Call(method_object, elapsed_time);
          }
        }
        ticked = true;
      } else
        break;
    }

    if (ticked && Am_Global_Timer_State == Am_TIMERS_SINGLE_STEP)
      Am_Set_Timer_State(Am_TIMERS_SUSPENDED);

    return_time = next_event->next_timeout;
  }
  return return_time;
}